

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Util.cpp
# Opt level: O0

size_t pe_util::forwarderNameLen(char *fPtr,size_t bufSize)

{
  bool bVar1;
  bool local_31;
  char *local_30;
  size_t len;
  size_t sStack_20;
  bool has_dot;
  size_t bufSize_local;
  char *fPtr_local;
  
  if ((fPtr == (char *)0x0) || (bufSize == 0)) {
    fPtr_local = (char *)0x0;
  }
  else {
    bVar1 = false;
    local_30 = (char *)0x0;
    sStack_20 = bufSize;
    bufSize_local = (size_t)fPtr;
    while( true ) {
      local_31 = true;
      if (*(char *)bufSize_local != '.') {
        local_31 = _isFuncChar(*(char *)bufSize_local);
      }
      if (local_31 == false) break;
      if (*(char *)bufSize_local == '.') {
        bVar1 = true;
      }
      local_30 = local_30 + 1;
      sStack_20 = sStack_20 - 1;
      if (sStack_20 == 0) break;
      bufSize_local = bufSize_local + 1;
    }
    if (*(char *)bufSize_local == '\0') {
      if (bVar1) {
        fPtr_local = local_30;
      }
      else {
        fPtr_local = (char *)0x0;
      }
    }
    else {
      fPtr_local = (char *)0x0;
    }
  }
  return (size_t)fPtr_local;
}

Assistant:

size_t pe_util::forwarderNameLen(const char* fPtr, size_t bufSize)
{
    if (!fPtr || bufSize == 0) return 0;
    
    // names can be also mangled, i.e. MSVCRT.??0__non_rtti_object@std@@QAE@ABV01@@Z
    bool has_dot = false;
    size_t len = 0;
    while ((*fPtr == '.') || _isFuncChar(*fPtr))
    {
        if (*fPtr == '.') has_dot = true;
        len++;
        if ((--bufSize) == 0) break;
        fPtr++;
    }
    if (*fPtr == '\0') {
        if (!has_dot) {
            return 0; //this is not a valid forwarder
        }
        return len;
    }
    return 0;
}